

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NIB.cpp
# Opt level: O0

void __thiscall Storage::Disk::NIB::NIB(NIB *this,string *file_name)

{
  byte bVar1;
  bool bVar2;
  stat *psVar3;
  undefined4 *puVar4;
  uint8_t next;
  string *file_name_local;
  NIB *this_local;
  
  DiskImage::DiskImage(&this->super_DiskImage);
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__NIB_00caa5f0;
  FileHolder::FileHolder(&this->file_,file_name,ReadWrite);
  this->cached_offset_ = 0;
  std::shared_ptr<Storage::Disk::PCMTrack>::shared_ptr(&this->cached_track_);
  psVar3 = FileHolder::stats(&this->file_);
  if (psVar3->st_size != 0x38e00) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0xfffffffe;
    __cxa_throw(puVar4,&Error::typeinfo,0);
  }
  do {
    bVar1 = FileHolder::get8(&this->file_);
    bVar2 = FileHolder::eof(&this->file_);
    if (bVar2) {
      return;
    }
  } while ((bVar1 & 0x80) != 0);
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0xfffffffe;
  __cxa_throw(puVar4,&Error::typeinfo,0);
}

Assistant:

NIB::NIB(const std::string &file_name) :
	file_(file_name) {
	// A NIB should be 35 tracks, each 6656 bytes long.
	if(file_.stats().st_size != track_length*number_of_tracks) {
		throw Error::InvalidFormat;
	}

	// A real NIB should have every single top bit set. Yes, 1/8th of the
	// file size is a complete waste. But it provides a hook for validation.
	while(true) {
		uint8_t next = file_.get8();
		if(file_.eof()) break;
		if(!(next & 0x80)) throw Error::InvalidFormat;
	}
}